

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::decryptInit
          (OSSLEVPSymmetricAlgorithm *this,SymmetricKey *key,Type mode,ByteString *IV,bool padding,
          size_t counterBits,ByteString *aad,size_t tagBytes)

{
  EVP_CIPHER *cipher_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uVar5;
  EVP_CIPHER_CTX *pEVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong uVar9;
  char *pcVar10;
  int in_EDX;
  long *in_RDI;
  byte in_R8B;
  ByteString *in_stack_00000008;
  OSSLEVPSymmetricAlgorithm *in_stack_00000010;
  ByteString dummy_4;
  int outLen;
  ByteString dummy_3;
  int rv;
  ByteString dummy_2;
  ByteString dummy_1;
  EVP_CIPHER *cipher;
  ByteString iv;
  ByteString dummy;
  OSSLEVPSymmetricAlgorithm *this_00;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  ByteString *in_stack_fffffffffffffdb0;
  ByteString *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  SymmetricAlgorithm *in_stack_fffffffffffffdc8;
  ByteString *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  int local_12c [12];
  int local_fc;
  undefined4 local_cc;
  EVP_CIPHER *local_a0;
  byte local_29;
  int local_1c;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_1c = in_EDX;
  bVar1 = SymmetricAlgorithm::decryptInit
                    (in_stack_fffffffffffffdc8,
                     (SymmetricKey *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0,
                     (bool)in_stack_fffffffffffffdaf,(size_t)in_stack_00000010,
                     in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_001bbf2b;
  }
  this_00 = in_stack_00000010;
  if ((local_1c != 5) &&
     (sVar3 = ByteString::size((ByteString *)0x1bb763), this_00 = in_stack_00000010, sVar3 != 0)) {
    sVar3 = ByteString::size((ByteString *)0x1bb77a);
    sVar4 = (**(code **)(*in_RDI + 0x68))();
    this_00 = in_stack_00000010;
    if (sVar3 != sVar4) {
      sVar3 = ByteString::size((ByteString *)0x1bb7b1);
      uVar5 = (**(code **)(*in_RDI + 0x68))();
      softHSMLog(3,"decryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x13a,"Invalid IV size (%d bytes, expected %d bytes)",sVar3,uVar5);
      ByteString::ByteString((ByteString *)0x1bb816);
      SymmetricAlgorithm::decryptFinal
                ((SymmetricAlgorithm *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8)
                 ,(ByteString *)in_stack_00000010);
      local_1 = 0;
      ByteString::~ByteString((ByteString *)0x1bb842);
      goto LAB_001bbf2b;
    }
  }
  ByteString::ByteString((ByteString *)0x1bb87a);
  sVar3 = ByteString::size((ByteString *)0x1bb887);
  if (sVar3 == 0) {
    (**(code **)(*in_RDI + 0x68))();
    ByteString::wipe(in_stack_fffffffffffffdb0,
                     CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
  }
  else {
    ByteString::operator=((ByteString *)this_00,in_stack_00000008);
  }
  counterBitsInit((OSSLEVPSymmetricAlgorithm *)
                  CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  local_a0 = (EVP_CIPHER *)(**(code **)(*in_RDI + 0xa8))();
  if (local_a0 == (EVP_CIPHER *)0x0) {
    softHSMLog(3,"decryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
               ,0x154,"Failed to initialise EVP decrypt operation");
    ByteString::ByteString((ByteString *)0x1bb996);
    SymmetricAlgorithm::decryptFinal
              ((SymmetricAlgorithm *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (ByteString *)this_00);
    local_1 = 0;
    local_cc = 1;
    ByteString::~ByteString((ByteString *)0x1bb9cf);
  }
  else {
    pEVar6 = EVP_CIPHER_CTX_new();
    cipher_00 = local_a0;
    in_RDI[0xc] = (long)pEVar6;
    if (in_RDI[0xc] == 0) {
      softHSMLog(3,"decryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x161,"Failed to allocate space for EVP_CIPHER_CTX");
      ByteString::ByteString((ByteString *)0x1bba5d);
      SymmetricAlgorithm::decryptFinal
                ((SymmetricAlgorithm *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8)
                 ,(ByteString *)this_00);
      local_1 = 0;
      local_cc = 1;
      ByteString::~ByteString((ByteString *)0x1bba96);
    }
    else {
      if (local_1c == 5) {
        local_fc = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)in_RDI[0xc],local_a0,(ENGINE *)0x0,
                                      (uchar *)0x0,(uchar *)0x0);
        if (local_fc != 0) {
          pEVar6 = (EVP_CIPHER_CTX *)in_RDI[0xc];
          sVar3 = ByteString::size((ByteString *)0x1bbb39);
          EVP_CIPHER_CTX_ctrl(pEVar6,9,(int)sVar3,(void *)0x0);
          pEVar6 = (EVP_CIPHER_CTX *)in_RDI[0xc];
          (**(code **)(*(long *)in_RDI[1] + 0x20))();
          puVar7 = ByteString::const_byte_str(in_stack_00000008);
          puVar8 = ByteString::byte_str(in_stack_00000008);
          local_fc = EVP_DecryptInit_ex(pEVar6,(EVP_CIPHER *)0x0,(ENGINE *)0x0,puVar7,puVar8);
        }
      }
      else {
        pEVar6 = (EVP_CIPHER_CTX *)in_RDI[0xc];
        (**(code **)(*(long *)in_RDI[1] + 0x20))();
        puVar7 = ByteString::const_byte_str(in_stack_00000008);
        puVar8 = ByteString::byte_str(in_stack_00000008);
        local_fc = EVP_DecryptInit(pEVar6,cipher_00,puVar7,puVar8);
      }
      if (local_fc == 0) {
        uVar9 = ERR_get_error();
        pcVar10 = ERR_error_string(uVar9,(char *)0x0);
        softHSMLog(3,"decryptInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0x17b,"Failed to initialise EVP decrypt operation: %s",pcVar10);
        clean(this_00);
        ByteString::ByteString((ByteString *)0x1bbd03);
        SymmetricAlgorithm::decryptFinal
                  ((SymmetricAlgorithm *)
                   CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                   (ByteString *)this_00);
        local_1 = 0;
        local_cc = 1;
        ByteString::~ByteString((ByteString *)0x1bbd3c);
      }
      else {
        EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)in_RDI[0xc],local_29 & 1);
        if (local_1c == 5) {
          local_12c[0] = 0;
          sVar3 = ByteString::size((ByteString *)0x1bbdab);
          if (sVar3 != 0) {
            pEVar6 = (EVP_CIPHER_CTX *)in_RDI[0xc];
            puVar7 = ByteString::const_byte_str(in_stack_00000008);
            sVar3 = ByteString::size((ByteString *)0x1bbdf3);
            iVar2 = EVP_DecryptUpdate(pEVar6,(uchar *)0x0,local_12c,puVar7,(int)sVar3);
            if (iVar2 == 0) {
              uVar9 = ERR_get_error();
              pcVar10 = ERR_error_string(uVar9,(char *)0x0);
              softHSMLog(3,"decryptInit",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                         ,0x18c,"Failed to update with AAD: %s",pcVar10);
              clean(this_00);
              ByteString::ByteString((ByteString *)0x1bbe9a);
              SymmetricAlgorithm::decryptFinal
                        ((SymmetricAlgorithm *)
                         CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                         (ByteString *)this_00);
              local_1 = 0;
              local_cc = 1;
              ByteString::~ByteString((ByteString *)0x1bbed3);
              goto LAB_001bbf0d;
            }
          }
        }
        local_1 = 1;
        local_cc = 1;
      }
    }
  }
LAB_001bbf0d:
  ByteString::~ByteString((ByteString *)0x1bbf1a);
LAB_001bbf2b:
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::decryptInit(const SymmetricKey* key, const SymMode::Type mode /* = SymMode::CBC */, const ByteString& IV /* = ByteString() */, bool padding /* = true */, size_t counterBits /* = 0 */, const ByteString& aad /* = ByteString() */, size_t tagBytes /* = 0 */)
{
	// Call the superclass initialiser
	if (!SymmetricAlgorithm::decryptInit(key, mode, IV, padding, counterBits, aad, tagBytes))
	{
		return false;
	}

	// Check the IV
	if (mode != SymMode::GCM && (IV.size() > 0) && (IV.size() != getBlockSize()))
	{
		ERROR_MSG("Invalid IV size (%d bytes, expected %d bytes)", IV.size(), getBlockSize());

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	ByteString iv;

	if (IV.size() > 0)
	{
		iv = IV;
	}
	else
	{
		iv.wipe(getBlockSize());
	}

	counterBitsInit(iv, counterBits);

	// Determine the cipher class
	const EVP_CIPHER* cipher = getCipher();

	if (cipher == NULL)
	{
		ERROR_MSG("Failed to initialise EVP decrypt operation");

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	// Allocate the EVP context
	pCurCTX = EVP_CIPHER_CTX_new();

	if (pCurCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_CIPHER_CTX");

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	int rv;
	if (mode == SymMode::GCM)
	{
		rv = EVP_DecryptInit_ex(pCurCTX, cipher, NULL, NULL, NULL);

		if (rv)
		{
			EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_SET_IVLEN, iv.size(), NULL);
			rv = EVP_DecryptInit_ex(pCurCTX, NULL, NULL, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
		}
	}
	else
	{
		rv = EVP_DecryptInit(pCurCTX, cipher, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
	}

	if (!rv)
	{
		ERROR_MSG("Failed to initialise EVP decrypt operation: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	EVP_CIPHER_CTX_set_padding(pCurCTX, padding ? 1 : 0);

	if (mode == SymMode::GCM)
	{
		int outLen = 0;
		if (aad.size() && !EVP_DecryptUpdate(pCurCTX, NULL, &outLen, (unsigned char*) aad.const_byte_str(), aad.size()))
		{
			ERROR_MSG("Failed to update with AAD: %s", ERR_error_string(ERR_get_error(), NULL));

			clean();

			ByteString dummy;
			SymmetricAlgorithm::decryptFinal(dummy);

			return false;
		}
	}

	return true;
}